

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<vector<float>_>::value_&&_HasData<vector<float>_>::value,_std::ostream_&>
pbrt::detail::operator<<(ostream *os,vector<float,_pstd::pmr::polymorphic_allocator<float>_> *v)

{
  float *pfVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  
  std::operator<<(os,"[ ");
  pfVar1 = v->ptr;
  for (uVar3 = 0; uVar3 < v->nStored; uVar3 = uVar3 + 1) {
    std::ostream::operator<<(os,pfVar1[uVar3]);
    if (uVar3 < v->nStored - 1) {
      std::operator<<(os,", ");
    }
  }
  poVar2 = std::operator<<(os," ]");
  return poVar2;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}